

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O0

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe20At4(uint8_t *buf)

{
  uint64_t res;
  uint8_t *buf_local;
  
  return (ulong)CONCAT21(CONCAT11(*buf,buf[1]),buf[2]) & 0xfffff;
}

Assistant:

std::uint64_t readFlUIntBe20At4(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[2];
    res &= UINT64_C(0xfffff);
    return res;
}